

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

void __thiscall
cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
          (MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this,void *ptr,
          size_type size)

{
  NoActionMemLogger *this_00;
  bool bVar1;
  char cVar2;
  MemChunk *this_01;
  Exception *pEVar3;
  size_type chunkSize_00;
  size_type sVar4;
  ulong uVar5;
  int local_5c;
  int i;
  char *paddingPtr;
  char diff;
  size_type userSize;
  size_type chunkSize;
  MemChunk *chunk;
  size_type size_local;
  void *ptr_local;
  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> *this_local;
  
  if (ptr == (void *)0x0) {
    NoActionMemLogger::logDeallocation(this->m_logger,(void *)0x0,size);
  }
  else {
    this_01 = mem2Chunk(ptr);
    bVar1 = MemChunk::isUsed(this_01);
    if (!bVar1) {
      pEVar3 = (Exception *)__cxa_allocate_exception(0x10);
      Exception::Exception(pEVar3,MEM_ERROR_DOUBLE_FREE,"potentially freeing an unused pointer");
      __cxa_throw(pEVar3,&Exception::typeinfo,0);
    }
    chunkSize_00 = MemChunk::getChunkSize(this_01);
    if ((this->m_padding & 1U) != 0) {
      if (chunkSize_00 < 0x11) {
        pEVar3 = (Exception *)__cxa_allocate_exception(0x10);
        Exception::Exception(pEVar3,MEM_ERROR_ASSERT,"assertion failure.");
        __cxa_throw(pEVar3,&Exception::typeinfo,0);
      }
      sVar4 = MemChunk::getUserSize(this_01);
      uVar5 = sVar4 + 0x10;
      if (chunkSize_00 <= uVar5) {
        pEVar3 = (Exception *)__cxa_allocate_exception(0x10);
        Exception::Exception(pEVar3,MEM_ERROR_ASSERT,"assertion failure.");
        __cxa_throw(pEVar3,&Exception::typeinfo,0);
      }
      cVar2 = (char)chunkSize_00 - (char)uVar5;
      if ((cVar2 < '\x01') || (uVar5 + (long)cVar2 != chunkSize_00)) {
        pEVar3 = (Exception *)__cxa_allocate_exception(0x10);
        Exception::Exception(pEVar3,MEM_ERROR_ASSERT,"assertion failure.");
        __cxa_throw(pEVar3,&Exception::typeinfo,0);
      }
      if (*(char *)((long)this_01 + (chunkSize_00 - 1)) != cVar2) {
        pEVar3 = (Exception *)__cxa_allocate_exception(0x10);
        Exception::Exception(pEVar3,MEM_ERROR_ASSERT,"assertion failure.");
        __cxa_throw(pEVar3,&Exception::typeinfo,0);
      }
      paddingPtr._7_1_ = cVar2 + -1;
      if ('\b' < paddingPtr._7_1_) {
        paddingPtr._7_1_ = '\b';
      }
      for (local_5c = 0; local_5c < paddingPtr._7_1_; local_5c = local_5c + 1) {
        if (*(char *)((long)&this_01[1].m_prevFootSize + (long)local_5c + sVar4) !=
            this->m_paddingByte) {
          pEVar3 = (Exception *)__cxa_allocate_exception(0x10);
          Exception::Exception(pEVar3,MEM_ERROR_PADDING,"padding byte got modified.");
          __cxa_throw(pEVar3,&Exception::typeinfo,0);
        }
      }
    }
    this_00 = this->m_logger;
    sVar4 = MemChunk::getUserSize(this_01);
    NoActionMemLogger::logDeallocation(this_00,ptr,sVar4);
    MemChunk::setFreeChunkSize(this_01,chunkSize_00);
    addChunk(this,this_01);
  }
  return;
}

Assistant:

void
    deallocate (T* ptr, size_type size = 0)
    {
        if (ptr != nullptr)
        {
            MemChunk* chunk = mem2Chunk (ptr);
            if (!chunk->isUsed())
            {
                throw Exception (MEM_ERROR_DOUBLE_FREE, "potentially freeing an unused pointer");
            }
            size_type chunkSize = chunk->getChunkSize ();
            if (m_padding)
            {
                COOKMEM_ASSERT (chunkSize > CHUNK_OVERHEAD);
                size_type userSize = chunk->getUserSize () + CHUNK_OVERHEAD;
                COOKMEM_ASSERT (userSize < chunkSize);
                char diff = (char)(chunkSize - userSize);
                COOKMEM_ASSERT ((diff > 0) && ((userSize + diff) == chunkSize));
                COOKMEM_ASSERT (*(((char*)chunk) + chunkSize - 1) == diff);

                char* paddingPtr = ((char*)chunk) + userSize;
                --diff;
                if (diff > 8)
                {
                    diff = 8;
                }
                for (int i = 0; i < diff; ++i)
                {
                    if (paddingPtr[i] != m_paddingByte)
                    {
                        throw Exception (MEM_ERROR_PADDING, "padding byte got modified.");
                    }
                }
            }
            m_logger.logDeallocation (ptr, chunk->getUserSize ());

            chunk->setFreeChunkSize (chunkSize);
            addChunk (chunk);
        }
        else
        {
            m_logger.logDeallocation (ptr, size);
        }
    }